

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O3

void __thiscall QFontComboBoxPrivate::updateModel(QFontComboBoxPrivate *this)

{
  QFont *this_00;
  undefined4 uVar1;
  QObject *this_01;
  long lVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  QAbstractItemView *pQVar6;
  char cVar7;
  char cVar8;
  QList_conflict *pQVar9;
  QAbstractItemView *this_02;
  long lVar10;
  int index;
  uint uVar11;
  QString *family;
  QString *args;
  long in_FS_OFFSET;
  QStringView QVar12;
  QStringView QVar13;
  QFontInfo fi;
  undefined8 local_f8;
  undefined8 uStack_f0;
  QAbstractItemView *local_e8;
  QString local_e0;
  QArrayData *local_c8;
  storage_type_conflict *local_c0;
  long local_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [16];
  qsizetype local_98;
  QArrayDataPointer<QString> local_88;
  QStringBuilder<QString,_QLatin1String> local_68;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QObject **)&(this->super_QComboBoxPrivate).super_QWidgetPrivate.field_0x8;
  cVar7 = QCoreApplication::closingDown();
  if (cVar7 == '\0') {
    QComboBox::model((QComboBox *)this_01);
    pQVar9 = (QList_conflict *)QMetaObject::cast((QObject *)&QStringListModel::staticMetaObject);
    if (pQVar9 != (QList_conflict *)0x0) {
      this_02 = (QAbstractItemView *)QComboBox::view((QComboBox *)this_01);
      QAbstractItemView::itemDelegate(this_02);
      QMetaObject::cast((QObject *)&QFontFamilyDelegate::staticMetaObject);
      index = 0;
      local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      QFontDatabase::families((WritingSystem)&local_88);
      local_a8 = (undefined1  [16])0x0;
      local_98 = 0;
      local_b0 = &DAT_aaaaaaaaaaaaaaaa;
      this_00 = &this->currentFont;
      QFontInfo::QFontInfo((QFontInfo *)&local_b0,this_00);
      if ((undefined1 *)local_88.size != (undefined1 *)0x0) {
        lVar10 = local_88.size * 0x18;
        index = 0;
        args = local_88.ptr;
        do {
          pQVar6 = local_e8;
          uVar5 = uStack_f0;
          uVar3 = local_f8;
          cVar7 = QFontDatabase::isPrivateFamily((QString *)args);
          if (cVar7 == '\0') {
            uVar11 = (this->filters).super_QFlagsStorageHelper<QFontComboBox::FontFilter,_4>.
                     super_QFlagsStorage<QFontComboBox::FontFilter>.i;
            if (((uVar11 & 3) != 0) && ((uVar11 & 3) != 3)) {
              local_68.a.d.d = (Data *)0x0;
              local_68.a.d.ptr = (char16_t *)0x0;
              local_68.a.d.size = 0;
              cVar7 = QFontDatabase::isSmoothlyScalable((QString *)args,(QString *)&local_68);
              if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                     _M_i + -1;
                UNLOCK();
                if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (((uVar11 & 1) == 0) == (bool)cVar7) goto LAB_0040641f;
              uVar11 = (this->filters).super_QFlagsStorageHelper<QFontComboBox::FontFilter,_4>.
                       super_QFlagsStorage<QFontComboBox::FontFilter>.i;
            }
            if (((uVar11 & 0xc) != 0) && ((uVar11 & 0xc) != 0xc)) {
              local_68.a.d.d = (Data *)0x0;
              local_68.a.d.ptr = (char16_t *)0x0;
              local_68.a.d.size = 0;
              cVar7 = QFontDatabase::isFixedPitch((QString *)args,(QString *)&local_68);
              if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                     _M_i + -1;
                UNLOCK();
                if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (((uVar11 & 4) == 0) == (bool)cVar7) goto LAB_0040641f;
            }
            QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                      ((QMovableArrayOps<QString> *)local_a8,local_98,args);
            QList<QString>::end((QList<QString> *)local_a8);
            QFontInfo::family();
            lVar2 = (args->d).size;
            if (lVar2 == local_b8) {
              QVar12.m_data = (args->d).ptr;
              QVar12.m_size = lVar2;
              QVar13.m_data = local_c0;
              QVar13.m_size = lVar2;
              cVar7 = QtPrivate::equalStrings(QVar12,QVar13);
              cVar8 = '\x01';
              if (cVar7 == '\0') goto LAB_00406300;
            }
            else {
LAB_00406300:
              QFontInfo::family();
              local_f8 = 0;
              uStack_f0 = 0;
              local_68.a.d.ptr = (char16_t *)uVar5;
              local_68.a.d.d = (Data *)uVar3;
              local_e8 = (QAbstractItemView *)0x0;
              local_68.a.d.size = (qsizetype)pQVar6;
              local_68.b.m_size = 2;
              local_68.b.m_data = " [";
              QStringBuilder<QString,_QLatin1String>::convertTo<QString>(&local_e0,&local_68);
              cVar8 = QString::startsWith((QString *)args,(CaseSensitivity)&local_e0);
              if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (&(local_68.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                     _M_i + -1;
                UNLOCK();
                if (((local_68.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_68.a.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            if (local_c8 != (QArrayData *)0x0) {
              LOCK();
              (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_c8,2,0x10);
              }
            }
            if (cVar8 != '\0') {
              index = (int)local_98 + -1;
            }
          }
LAB_0040641f:
          args = args + 1;
          lVar10 = lVar10 + -0x18;
        } while (lVar10 != 0);
      }
      QObject::blockSignals(SUB81(pQVar9,0));
      QStringListModel::setStringList(pQVar9);
      cVar7 = QAccessible::isActive();
      if (cVar7 != '\0') {
        local_68.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.a.d.size = (qsizetype)QComboBox::view((QComboBox *)this_01);
        local_68.b.m_size = 0xffffffff;
        local_68.b.m_data = (char *)0xffffffffffffffff;
        uStack_40 = 0xffffffff;
        uStack_3c = 0xffffffff;
        local_68.a.d.ptr._0_4_ = 0x116;
        local_68.a.d.d = (Data *)QIcon::QIcon;
        QAccessible::updateAccessibility((QAccessibleEvent *)&local_68);
        QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent
                  ((QAccessibleTableModelChangeEvent *)&local_68);
      }
      QObject::blockSignals(SUB81(pQVar9,0));
      if (local_98 == 0) {
        QFont::QFont((QFont *)&local_68);
        cVar7 = QFont::operator!=(this_00,(QFont *)&local_68);
        QFont::~QFont((QFont *)&local_68);
        if (cVar7 != '\0') {
          QFont::QFont((QFont *)&local_68);
          uVar3 = *(undefined8 *)&this->currentFont;
          *(Data **)&this->currentFont = local_68.a.d.d;
          uVar1 = *(undefined4 *)&this->field_0x360;
          *(undefined4 *)&this->field_0x360 = local_68.a.d.ptr._0_4_;
          local_68.a.d.ptr._0_4_ = uVar1;
          local_68.a.d.d = (Data *)uVar3;
          QFont::~QFont((QFont *)&local_68);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = this_00;
          local_68.a.d._0_16_ = auVar4 << 0x40;
          QMetaObject::activate(this_01,&QFontComboBox::staticMetaObject,0,(void **)&local_68);
        }
      }
      else {
        QComboBox::setCurrentIndex((QComboBox *)this_01,index);
      }
      QFontInfo::~QFontInfo((QFontInfo *)&local_b0);
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_a8);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontComboBoxPrivate::updateModel()
{
    Q_Q(QFontComboBox);

    if (QCoreApplication::closingDown())
        return;

    const int scalableMask = (QFontComboBox::ScalableFonts | QFontComboBox::NonScalableFonts);
    const int spacingMask = (QFontComboBox::ProportionalFonts | QFontComboBox::MonospacedFonts);

    QStringListModel *m = qobject_cast<QStringListModel *>(q->model());
    if (!m)
        return;
    QFontFamilyDelegate *delegate = qobject_cast<QFontFamilyDelegate *>(q->view()->itemDelegate());
    QFontDatabase::WritingSystem system = delegate ? delegate->writingSystem : QFontDatabase::Any;

    const QStringList list = QFontDatabase::families(system);
    QStringList result;

    int offset = 0;
    QFontInfo fi(currentFont);

    for (const auto &family : list) {
        if (QFontDatabase::isPrivateFamily(family))
            continue;

        if ((filters & scalableMask) && (filters & scalableMask) != scalableMask) {
            if (bool(filters & QFontComboBox::ScalableFonts) != QFontDatabase::isSmoothlyScalable(family))
                continue;
        }
        if ((filters & spacingMask) && (filters & spacingMask) != spacingMask) {
            if (bool(filters & QFontComboBox::MonospacedFonts) != QFontDatabase::isFixedPitch(family))
                continue;
        }
        result += family;
        if (family == fi.family() || family.startsWith(fi.family() + " ["_L1))
            offset = result.size() - 1;
    }

    //we need to block the signals so that the model doesn't emit reset
    //this prevents the current index from changing
    //it will be updated just after this
    ///TODO: we should finda way to avoid blocking signals and have a real update of the model
    {
        const QSignalBlocker blocker(m);
        m->setStringList(result);
        // Since the modelReset signal is blocked the view will not emit an accessibility event
    #if QT_CONFIG(accessibility)
        if (QAccessible::isActive()) {
            QAccessibleTableModelChangeEvent accessibleEvent(q->view(), QAccessibleTableModelChangeEvent::ModelReset);
            QAccessible::updateAccessibility(&accessibleEvent);
        }
    #endif
    }

    if (result.isEmpty()) {
        if (currentFont != QFont()) {
            currentFont = QFont();
            emit q->currentFontChanged(currentFont);
        }
    } else {
        q->setCurrentIndex(offset);
    }
}